

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_shifti(TCGContext_conflict9 *s,int subopc,int reg,int count)

{
  int ext;
  int count_local;
  int reg_local;
  int subopc_local;
  TCGContext_conflict9 *s_local;
  
  if (count == 1) {
    tcg_out_modrm(s,(subopc & 0xfffffff8U) + 0xd1,subopc & 7U,reg);
  }
  else {
    tcg_out_modrm(s,(subopc & 0xfffffff8U) + 0xc1,subopc & 7U,reg);
    tcg_out8(s,(uint8_t)count);
  }
  return;
}

Assistant:

static void tcg_out_shifti(TCGContext *s, int subopc, int reg, int count)
{
    /* Propagate an opcode prefix, such as P_DATA16.  */
    int ext = subopc & ~0x7;
    subopc &= 0x7;

    if (count == 1) {
        tcg_out_modrm(s, OPC_SHIFT_1 + ext, subopc, reg);
    } else {
        tcg_out_modrm(s, OPC_SHIFT_Ib + ext, subopc, reg);
        tcg_out8(s, count);
    }
}